

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       list_caster<std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::pair<long,long>>
       ::cast<std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&>
                 (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *src,
                 return_value_policy policy,handle parent)

{
  pointer ppVar1;
  handle hVar2;
  long lVar3;
  PyObject *tmp;
  pointer ppVar4;
  list l;
  object value_;
  handle local_40;
  handle local_38;
  
  list::list((list *)&local_40,
             (long)(src->
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(src->
                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  ppVar4 = (src->super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (src->super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 0;
  do {
    hVar2.m_ptr = local_40.m_ptr;
    if (ppVar4 == ppVar1) {
      local_40.m_ptr = (PyObject *)0x0;
      goto LAB_001c7502;
    }
    hVar2 = tuple_caster<std::pair,long,long>::cast_impl<std::pair<long,long>&,0ul,1ul>
                      (ppVar4,policy,parent.m_ptr);
    local_38 = hVar2;
    if (hVar2.m_ptr != (PyObject *)0x0) {
      local_38.m_ptr = (PyObject *)0x0;
      (&((local_40.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt)[lVar3] = (Py_ssize_t)hVar2.m_ptr;
      lVar3 = lVar3 + 1;
    }
    object::~object((object *)&local_38);
    ppVar4 = ppVar4 + 1;
  } while (hVar2.m_ptr != (PyObject *)0x0);
  hVar2.m_ptr = (PyObject *)0x0;
LAB_001c7502:
  object::~object((object *)&local_40);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }